

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idn.c
# Opt level: O3

CURLcode Curl_idnconvert_hostname(hostname *host)

{
  host->dispname = host->name;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_idnconvert_hostname(struct hostname *host)
{
  /* set the name we use to display the host name */
  host->dispname = host->name;

#ifdef USE_IDN
  /* Check name for non-ASCII and convert hostname if we can */
  if(!Curl_is_ASCII_name(host->name)) {
    char *decoded;
    CURLcode result = idn_decode(host->name, &decoded);
    if(!result) {
      if(!*decoded) {
        /* zero length is a bad host name */
        Curl_idn_free(decoded);
        return CURLE_URL_MALFORMAT;
      }
      /* successful */
      host->encalloc = decoded;
      /* change the name pointer to point to the encoded hostname */
      host->name = host->encalloc;
    }
    else
      return result;
  }
#endif
  return CURLE_OK;
}